

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O0

void __thiscall RBTS<TTA>::PerformLabeling(RBTS<TTA> *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uchar *puVar9;
  uint *puVar10;
  bool bVar11;
  bool bVar12;
  uint *puStack_160;
  int c_i;
  uint *img_labels_row_1;
  uint *img_labels_row_end;
  uint *img_labels_row_start;
  uint local_140;
  int r_i;
  uint i_1;
  uint start_1;
  uint val_1;
  uint i;
  uint start;
  uint val;
  int iStack_120;
  bool next;
  int t;
  int h_1;
  int e;
  int crb;
  int s;
  int clb;
  int c;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row;
  undefined1 local_e8 [4];
  int r;
  CircularBuffer<int> e_queue;
  CircularBuffer<int> s_queue;
  int buffer_capacity;
  int h;
  int w;
  int local_7c;
  Size local_78;
  Mat_<int> local_70;
  RBTS<TTA> *local_10;
  RBTS<TTA> *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  local_7c = 0;
  cv::Mat_<int>::Mat_(&local_70,&local_78,&local_7c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  TTA::Alloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1) + 1
            );
  TTA::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  iVar6 = iVar1 / 2 + 2;
  CircularBuffer<int>::CircularBuffer((CircularBuffer<int> *)&e_queue.head_,(long)iVar6);
  CircularBuffer<int>::CircularBuffer((CircularBuffer<int> *)local_e8,(long)iVar6);
  for (img_row._4_4_ = 0; img_row._4_4_ < iVar2; img_row._4_4_ = img_row._4_4_ + 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,img_row._4_4_);
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (s = 0; s < iVar1; s = s + 1) {
      if (puVar9[s] != '\0') {
        bVar11 = s != 0;
        iVar6 = CircularBuffer<int>::Enqueue
                          ((CircularBuffer<int> *)&e_queue.head_,iVar1 * img_row._4_4_ + s);
        do {
          iVar5 = s;
          s = iVar5 + 1;
          bVar12 = false;
          if (s < iVar1) {
            bVar12 = puVar9[s] != '\0';
          }
        } while (bVar12);
        bVar12 = s != iVar1;
        iVar7 = CircularBuffer<int>::Enqueue
                          ((CircularBuffer<int> *)local_e8,iVar1 * img_row._4_4_ + iVar5);
        iStack_120 = CircularBuffer<int>::Front((CircularBuffer<int> *)&e_queue.head_);
        val = CircularBuffer<int>::Front((CircularBuffer<int> *)local_e8);
        while ((int)val < (int)((iVar6 - iVar1) - (uint)bVar11)) {
          iStack_120 = CircularBuffer<int>::DequeueAndFront((CircularBuffer<int> *)&e_queue.head_);
          val = CircularBuffer<int>::DequeueAndFront((CircularBuffer<int> *)local_e8);
        }
        bVar11 = false;
        s = iVar5;
        if ((int)((iVar7 - iVar1) + (uint)bVar12) < iStack_120) {
          uVar8 = TTA::NewLabel();
          for (local_140 = iVar6 % iVar1; local_140 < ((iVar6 % iVar1 + iVar7) - iVar6) + 1U;
              local_140 = local_140 + 1) {
            puVar10[local_140] = uVar8;
          }
        }
        else {
          uVar8 = *(uint *)((long)puVar10 + ((long)(iStack_120 % iVar1) * 4 - lVar4));
          for (start_1 = iVar6 % iVar1; start_1 < ((iVar6 % iVar1 + iVar7) - iVar6) + 1U;
              start_1 = start_1 + 1) {
            puVar10[start_1] = uVar8;
          }
          while ((int)val <= iVar7 - iVar1) {
            if (bVar11) {
              TTA::Merge(*(uint *)((long)puVar10 + ((long)(iStack_120 % iVar1) * 4 - lVar4)),uVar8);
            }
            bVar11 = true;
            iStack_120 = CircularBuffer<int>::DequeueAndFront((CircularBuffer<int> *)&e_queue.head_)
            ;
            val = CircularBuffer<int>::DequeueAndFront((CircularBuffer<int> *)local_e8);
          }
          while ((int)val < (iVar7 - iVar1) + 1) {
            bVar11 = true;
            CircularBuffer<int>::Dequeue((CircularBuffer<int> *)&e_queue.head_);
            CircularBuffer<int>::Dequeue((CircularBuffer<int> *)local_e8);
            iStack_120 = CircularBuffer<int>::Front((CircularBuffer<int> *)&e_queue.head_);
            val = CircularBuffer<int>::Front((CircularBuffer<int> *)local_e8);
          }
          if ((iStack_120 <= (int)((iVar7 - iVar1) + (uint)bVar12)) && (bVar11)) {
            TTA::Merge(puVar10[iVar6 % iVar1],
                       *(uint *)((long)puVar10 + ((long)(iStack_120 % iVar1) * 4 - lVar4)));
          }
        }
      }
    }
  }
  uVar8 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar8;
  for (img_labels_row_start._4_4_ = 0;
      img_labels_row_start._4_4_ <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      img_labels_row_start._4_4_ = img_labels_row_start._4_4_ + 1) {
    puStack_160 = cv::Mat::ptr<unsigned_int>
                            (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                              super_Mat,img_labels_row_start._4_4_);
    puVar10 = puStack_160 +
              *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
    for (; puStack_160 != puVar10; puStack_160 = puStack_160 + 1) {
      uVar8 = TTA::GetLabel(*puStack_160);
      *puStack_160 = uVar8;
    }
  }
  TTA::Dealloc();
  CircularBuffer<int>::~CircularBuffer((CircularBuffer<int> *)local_e8);
  CircularBuffer<int>::~CircularBuffer((CircularBuffer<int> *)&e_queue.head_);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        CircularBuffer<int> s_queue(buffer_capacity);
        CircularBuffer<int> e_queue(buffer_capacity);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue.Front();
                int t = e_queue.Front();
                while (t < s - w - clb) {
                    h = s_queue.DequeueAndFront();
                    t = e_queue.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue.DequeueAndFront();
                        t = e_queue.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue.Dequeue();
                        e_queue.Dequeue();
                        h = s_queue.Front();
                        t = e_queue.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int* img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int* img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int* img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }